

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::initialize<bool(*&)(std::vector<long,std::allocator<long>>const&,std::
vector<long,std::allocator<long>>const&),bool,std::vector<long,std::allocator<long>>const&,std::
vector<long,std::allocator<long>>const&,pybind11::name,pybind11::is_method,pybind11::
sibling,pybind11::operator>
          (cpp_function *this,
          _func_bool_vector<long,_std::allocator<long>_>_ptr_vector<long,_std::allocator<long>_>_ptr
          **f,_func_bool_vector<long,_std::allocator<long>_>_ptr_vector<long,_std::allocator<long>_>_ptr
              *param_3,name *extra,is_method *extra_1,sibling *extra_2,is_operator *extra_3)

{
  _func_handle_function_call_ptr *p_Var1;
  EVP_PKEY_CTX *in_RCX;
  undefined8 *in_RSI;
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  *in_RDI;
  bool is_function_ptr;
  bool has_arg_annotations;
  bool has_args;
  bool has_pos_only_args;
  bool has_kw_only_args;
  pointer rec;
  unique_function_record unique_rec;
  size_t in_stack_00000510;
  type_info **in_stack_00000518;
  char *in_stack_00000520;
  unique_function_record *in_stack_00000528;
  cpp_function *in_stack_00000530;
  undefined1 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffa9;
  undefined1 in_stack_ffffffffffffffaa;
  undefined1 in_stack_ffffffffffffffab;
  undefined4 in_stack_ffffffffffffffac;
  detail local_41;
  pointer local_40;
  EVP_PKEY_CTX *local_20;
  undefined8 *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  make_function_record
            ((cpp_function *)
             CONCAT44(in_stack_ffffffffffffffac,
                      CONCAT13(in_stack_ffffffffffffffab,
                               CONCAT12(in_stack_ffffffffffffffaa,
                                        CONCAT11(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8
                                                )))));
  local_40 = std::
             unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
             ::get(in_RDI);
  local_40->data[0] = (void *)*local_10;
  p_Var1 = is_TEMPNAMEPLACEHOLDERVALUE(bool(*&)(std::vector<long,std::allocator<long>>const&,std::
           vector<long,std::allocator<long>>const&),bool(*)(std::vector<long,std::
           allocator<long>>const&,std::vector<long,std::allocator<long>>const&),pybind11::
           name_const&,pybind11::is_method_const&,pybind11::sibling_const&,pybind11::
           is_operator_const&)::{lambda(pybind11::detail::function_call&)#1}::operator_pybind11::
           handle(*)(pybind11::detail::operator>(&local_41);
  local_40->impl = p_Var1;
  pybind11::detail::
  process_attributes<pybind11::name,_pybind11::is_method,_pybind11::sibling,_pybind11::is_operator>
  ::init(local_20);
  std::array<const_std::type_info_*,_1UL>::data((array<const_std::type_info_*,_1UL> *)0x2c5e6c);
  initialize_generic(in_stack_00000530,in_stack_00000528,in_stack_00000520,in_stack_00000518,
                     in_stack_00000510);
  *(ushort *)&local_40->field_0x59 = *(ushort *)&local_40->field_0x59 & 0xfffb | 4;
  local_40->data[1] =
       &(*)(std::vector<long,std::allocator<long>>const&,std::vector<long,std::allocator<long>>const&)
        ::typeinfo;
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr(in_RDI);
  return;
}

Assistant:

void initialize(Func &&f, Return (*)(Args...), const Extra&... extra) {
        using namespace detail;
        struct capture { remove_reference_t<Func> f; };

        /* Store the function including any extra state it might have (e.g. a lambda capture object) */
        // The unique_ptr makes sure nothing is leaked in case of an exception.
        auto unique_rec = make_function_record();
        auto rec = unique_rec.get();

        /* Store the capture object directly in the function record if there is enough space */
        if (sizeof(capture) <= sizeof(rec->data)) {
            /* Without these pragmas, GCC warns that there might not be
               enough space to use the placement new operator. However, the
               'if' statement above ensures that this is the case. */
#if defined(__GNUG__) && !defined(__clang__) && __GNUC__ >= 6
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wplacement-new"
#endif
            new ((capture *) &rec->data) capture { std::forward<Func>(f) };
#if defined(__GNUG__) && !defined(__clang__) && __GNUC__ >= 6
#  pragma GCC diagnostic pop
#endif
            if (!std::is_trivially_destructible<Func>::value)
                rec->free_data = [](function_record *r) { ((capture *) &r->data)->~capture(); };
        } else {
            rec->data[0] = new capture { std::forward<Func>(f) };
            rec->free_data = [](function_record *r) { delete ((capture *) r->data[0]); };
        }

        /* Type casters for the function arguments and return value */
        using cast_in = argument_loader<Args...>;
        using cast_out = make_caster<
            conditional_t<std::is_void<Return>::value, void_type, Return>
        >;

        static_assert(expected_num_args<Extra...>(sizeof...(Args), cast_in::has_args, cast_in::has_kwargs),
                      "The number of argument annotations does not match the number of function arguments");

        /* Dispatch code which converts function arguments and performs the actual function call */
        rec->impl = [](function_call &call) -> handle {
            cast_in args_converter;

            /* Try to cast the function arguments into the C++ domain */
            if (!args_converter.load_args(call))
                return PYBIND11_TRY_NEXT_OVERLOAD;

            /* Invoke call policy pre-call hook */
            process_attributes<Extra...>::precall(call);

            /* Get a pointer to the capture object */
            auto data = (sizeof(capture) <= sizeof(call.func.data)
                         ? &call.func.data : call.func.data[0]);
            auto *cap = const_cast<capture *>(reinterpret_cast<const capture *>(data));

            /* Override policy for rvalues -- usually to enforce rvp::move on an rvalue */
            return_value_policy policy = return_value_policy_override<Return>::policy(call.func.policy);

            /* Function scope guard -- defaults to the compile-to-nothing `void_type` */
            using Guard = extract_guard_t<Extra...>;

            /* Perform the function call */
            handle result = cast_out::cast(
                std::move(args_converter).template call<Return, Guard>(cap->f), policy, call.parent);

            /* Invoke call policy post-call hook */
            process_attributes<Extra...>::postcall(call, result);

            return result;
        };

        /* Process any user-provided function attributes */
        process_attributes<Extra...>::init(extra..., rec);

        {
            constexpr bool has_kw_only_args = any_of<std::is_same<kw_only, Extra>...>::value,
                           has_pos_only_args = any_of<std::is_same<pos_only, Extra>...>::value,
                           has_args = any_of<std::is_same<args, Args>...>::value,
                           has_arg_annotations = any_of<is_keyword<Extra>...>::value;
            static_assert(has_arg_annotations || !has_kw_only_args, "py::kw_only requires the use of argument annotations");
            static_assert(has_arg_annotations || !has_pos_only_args, "py::pos_only requires the use of argument annotations (for docstrings and aligning the annotations to the argument)");
            static_assert(!(has_args && has_kw_only_args), "py::kw_only cannot be combined with a py::args argument");
        }

        /* Generate a readable signature describing the function's arguments and return value types */
        static constexpr auto signature = _("(") + cast_in::arg_names + _(") -> ") + cast_out::name;
        PYBIND11_DESCR_CONSTEXPR auto types = decltype(signature)::types();

        /* Register the function with Python from generic (non-templated) code */
        // Pass on the ownership over the `unique_rec` to `initialize_generic`. `rec` stays valid.
        initialize_generic(std::move(unique_rec), signature.text, types.data(), sizeof...(Args));

        if (cast_in::has_args) rec->has_args = true;
        if (cast_in::has_kwargs) rec->has_kwargs = true;

        /* Stash some additional information used by an important optimization in 'functional.h' */
        using FunctionType = Return (*)(Args...);
        constexpr bool is_function_ptr =
            std::is_convertible<Func, FunctionType>::value &&
            sizeof(capture) == sizeof(void *);
        if (is_function_ptr) {
            rec->is_stateless = true;
            rec->data[1] = const_cast<void *>(reinterpret_cast<const void *>(&typeid(FunctionType)));
        }
    }